

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

const_iterator __thiscall
pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator::operator+
          (const_iterator *this,uint x)

{
  const_iterator cVar1;
  uint x_local;
  const_iterator *this_local;
  const_iterator result;
  
  this_local = *(const_iterator **)this;
  result._0_8_ = this->pos_;
  std::
  advance<pstore::sparse_array<unsigned_long,unsigned_int>::indices::const_iterator,unsigned_int>
            ((const_iterator *)&this_local,x);
  cVar1._0_8_ = (ulong)this_local & 0xffffffff;
  cVar1.pos_ = result._0_8_;
  return cVar1;
}

Assistant:

const_iterator operator+ (unsigned x) const {
                    auto result = *this;
                    std::advance (result, x);
                    return result;
                }